

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  CommandLineInterface *pCVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  long lVar7;
  ulong uVar8;
  LogMessage *other;
  ostream *poVar9;
  int version;
  size_type sVar10;
  long lVar11;
  ulong uVar12;
  pointer pcVar13;
  char *pcVar14;
  char cVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_02;
  _Base_ptr p_Var16;
  string *psVar17;
  undefined8 __v;
  bool bVar18;
  bool bVar19;
  _Alloc_node __an;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string plugin_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  CommandLineInterface *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  undefined1 local_a0 [40];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Base_ptr local_38;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "You seem to have passed an empty string as one of the arguments to ",0x43);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->executable_name_)._M_dataplus._M_p,
                        (this->executable_name_)._M_string_length);
    pcVar14 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
    lVar11 = 0x7b;
LAB_002082c8:
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    return PARSE_ARGUMENT_FAIL;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = 0;
    local_a8 = 0;
    local_e0 = this;
    SplitStringUsing(value,":",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_b8);
    bVar18 = local_b8._8_8_ != local_b8._M_allocated_capacity;
    if (bVar18) {
      local_e0 = (CommandLineInterface *)&local_e0->proto_path_;
      lVar11 = 0;
      uVar12 = 0;
      do {
        local_d8._M_allocated_capacity = (size_type)&local_c8;
        local_d8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        local_100._M_string_length = 0;
        local_100.field_2._M_local_buf[0] = '\0';
        lVar7 = std::__cxx11::string::find((char)local_b8._M_allocated_capacity + (char)lVar11,0x3d)
        ;
        if (lVar7 == -1) {
          std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)local_d8._8_8_,0x357dff);
          std::__cxx11::string::_M_assign((string *)&local_100);
        }
        else {
          std::__cxx11::string::substr((ulong)local_a0,local_b8._M_allocated_capacity + lVar11);
          std::__cxx11::string::operator=((string *)local_d8._M_local_buf,(string *)local_a0);
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
          }
          std::__cxx11::string::substr((ulong)local_a0,local_b8._M_allocated_capacity + lVar11);
          std::__cxx11::string::operator=((string *)&local_100,(string *)local_a0);
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
          }
        }
        sVar10 = local_100._M_string_length;
        if ((string *)local_100._M_string_length == (string *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                     ,0x4b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        else {
          iVar3 = access(local_100._M_dataplus._M_p,0);
          if (iVar3 < 0) {
            iVar3 = access(*(char **)(local_b8._M_allocated_capacity + lVar11),0);
            if (iVar3 < 0) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_100._M_dataplus._M_p,
                                  local_100._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": warning: directory does not exist.",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            else {
              std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)local_d8._8_8_,0x357dff);
              std::__cxx11::string::_M_assign((string *)&local_100);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_100);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)local_e0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0);
          if ((undefined1 *)local_a0._32_8_ != local_78 + 8) {
            operator_delete((void *)local_a0._32_8_,local_78._8_8_ + 1);
          }
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1)
          ;
        }
        if ((string *)sVar10 == (string *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_b8);
          if (!bVar18) {
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
          return PARSE_ARGUMENT_FAIL;
        }
        uVar12 = uVar12 + 1;
        uVar8 = (long)(local_b8._8_8_ - local_b8._0_8_) >> 5;
        lVar11 = lVar11 + 0x20;
        bVar18 = uVar12 < uVar8;
      } while (uVar12 < uVar8);
    }
    this_02 = &local_b8;
LAB_00208216:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_02);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    if (this->direct_dependencies_explicitly_set_ == true) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar14 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
      lVar11 = 0x78;
      goto LAB_002082c8;
    }
    this->direct_dependencies_explicitly_set_ = true;
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_c8._M_allocated_capacity = 0;
    SplitStringUsing(value,":",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_d8);
    if ((this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x4e2);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_a0,"CHECK failed: direct_dependencies_.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_100,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_a0);
    }
    uVar2 = local_d8._8_8_;
    this_00 = &this->direct_dependencies_;
    local_100._M_dataplus._M_p = (pointer)this_00;
    if (local_d8._M_allocated_capacity != local_d8._8_8_) {
      __v = local_d8._M_allocated_capacity;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,
                   (const_iterator)&(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                   (_Alloc_node *)&local_100);
        __v = __v + 0x20;
      } while (__v != uVar2);
    }
    this_02 = &local_d8;
    goto LAB_00208216;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    psVar17 = (string *)&this->direct_dependencies_violation_msg_;
LAB_00208347:
    std::__cxx11::string::_M_assign(psVar17);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
    if ((this->descriptor_set_name_)._M_string_length == 0) {
      if (value->_M_string_length != 0) {
        if (this->mode_ == MODE_COMPILE) {
          psVar17 = (string *)&this->descriptor_set_name_;
          goto LAB_00208347;
        }
        poVar9 = (ostream *)&std::cerr;
        pcVar14 = "Cannot use --encode or --decode and generate descriptors at the same time.";
        lVar11 = 0x4a;
        goto LAB_0020832c;
      }
LAB_00208480:
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar14 = " requires a non-empty value.";
      lVar11 = 0x1c;
      goto LAB_0020832c;
    }
LAB_00208307:
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar14 = " may only be passed once.";
    lVar11 = 0x19;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      if ((this->dependency_out_name_)._M_string_length == 0) {
        if (value->_M_string_length != 0) {
          psVar17 = (string *)&this->dependency_out_name_;
          goto LAB_00208347;
        }
        goto LAB_00208480;
      }
      goto LAB_00208307;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      if (this->imports_in_descriptor_set_ != true) {
        this->imports_in_descriptor_set_ = true;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      goto LAB_00208307;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      if (this->source_info_in_descriptor_set_ != true) {
        this->source_info_in_descriptor_set_ = true;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      goto LAB_00208307;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
      PrintHelpText(this);
      return PARSE_ARGUMENT_DONE_AND_EXIT;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      sVar10 = (this->version_info_)._M_string_length;
      if (sVar10 != 0) {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->version_info_)._M_dataplus._M_p,sVar10);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"libprotoc ",10);
      internal::VersionString_abi_cxx11_((string *)local_a0,(internal *)0x2dd278,version);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_a0._0_8_,local_a0._8_8_);
      std::endl<char,std::char_traits<char>>(poVar9);
      if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
        return PARSE_ARGUMENT_DONE_AND_EXIT;
      }
      operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
      return PARSE_ARGUMENT_DONE_AND_EXIT;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      this->disallow_services_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) ||
       (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 == 0)) {
      if (this->mode_ == MODE_COMPILE) {
        if (((this->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((this->descriptor_set_name_)._M_string_length == 0)) {
          iVar3 = std::__cxx11::string::compare((char *)name);
          this->mode_ = MODE_DECODE - (iVar3 == 0);
          if ((value->_M_string_length == 0) &&
             (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Type name for ",0xe);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," cannot be blank.",0x11);
            std::endl<char,std::char_traits<char>>(poVar9);
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",
                         0x2f);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              return PARSE_ARGUMENT_FAIL;
            }
            return PARSE_ARGUMENT_FAIL;
          }
          if ((value->_M_string_length == 0) ||
             (iVar3 = std::__cxx11::string::compare((char *)name), iVar3 != 0)) {
            psVar17 = (string *)&this->codec_type_;
            goto LAB_00208347;
          }
          pcVar14 = "--decode_raw does not take a parameter.";
          goto LAB_002088a5;
        }
LAB_002089c9:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot use ",0xb);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        pcVar14 = " and generate code or descriptors at the same time.";
        lVar11 = 0x33;
      }
      else {
        poVar9 = (ostream *)&std::cerr;
        pcVar14 = "Only one of --encode and --decode can be specified.";
        lVar11 = 0x33;
      }
      goto LAB_0020832c;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      iVar3 = std::__cxx11::string::compare((char *)value);
      if (iVar3 == 0) {
        this->error_format_ = ERROR_FORMAT_GCC;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      iVar3 = std::__cxx11::string::compare((char *)value);
      if (iVar3 == 0) {
        this->error_format_ = ERROR_FORMAT_MSVS;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown error format: ",0x16);
      pcVar13 = (value->_M_dataplus)._M_p;
      sVar10 = value->_M_string_length;
LAB_0020867b:
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pcVar13,sVar10);
      goto LAB_00208334;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    cVar15 = (char)value;
    if (iVar3 == 0) {
      if ((this->plugin_prefix_)._M_string_length != 0) {
        local_a0._8_8_ = (char *)0x0;
        local_a0[0x10] = '\0';
        local_d8._8_8_ = 0;
        local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
        local_d8._M_allocated_capacity = (size_type)&local_c8;
        local_a0._0_8_ = local_a0 + 0x10;
        lVar11 = std::__cxx11::string::find(cVar15,0x3d);
        if (lVar11 == -1) {
          lVar11 = std::__cxx11::string::rfind(cVar15,0x2f);
          if (lVar11 == -1) {
            std::__cxx11::string::_M_assign((string *)local_a0);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_100,(ulong)value);
            std::__cxx11::string::operator=((string *)local_a0,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__cxx11::string::_M_assign((string *)local_d8._M_local_buf);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_100,(ulong)value);
          std::__cxx11::string::operator=((string *)local_a0,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::substr((ulong)&local_100,(ulong)value);
          std::__cxx11::string::operator=((string *)local_d8._M_local_buf,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
        }
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->plugins_,(key_type *)local_a0);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1)
          ;
        }
        if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      pcVar14 = "This compiler does not support plugins.";
LAB_002088a5:
      poVar9 = (ostream *)&std::cerr;
      lVar11 = 0x27;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        if (this->mode_ == MODE_COMPILE) {
          if (((this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((this->descriptor_set_name_)._M_string_length == 0)) {
            this->mode_ = MODE_PRINT;
            this->print_mode_ = PRINT_FREE_FIELDS;
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
          goto LAB_002089c9;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot use ",0xb);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," and use --encode, --decode or print ",0x25);
        pcVar14 = "other info at the same time.";
        lVar11 = 0x1c;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                ::find(&(this->generators_by_flag_name_)._M_t,name);
        local_38 = &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var5 = iVar4._M_node + 2;
        bVar19 = false;
        p_Var16 = (_Base_ptr)0x0;
        bVar18 = false;
        local_e0 = this;
        if (iVar4._M_node == local_38) {
          p_Var5 = p_Var16;
          if ((this->plugin_prefix_)._M_string_length == 0) {
            bVar18 = true;
            bVar19 = false;
          }
          else {
            local_d8._M_allocated_capacity = (size_type)&local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"_out","");
            bVar19 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name->_M_string_length < (ulong)local_d8._8_8_) {
              bVar18 = true;
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((ulong)name,(long)name->_M_string_length - local_d8._8_8_,
                                 (string *)local_d8._8_8_);
              bVar18 = iVar3 != 0;
            }
          }
        }
        if ((bVar19) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity != &local_c8)) {
          operator_delete((void *)local_d8._M_allocated_capacity,local_c8._M_allocated_capacity + 1)
          ;
        }
        pCVar1 = local_e0;
        if (bVar18) {
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                  ::find(&(local_e0->generators_by_option_name_)._M_t,name);
          if ((_Rb_tree_header *)iVar4._M_node !=
              &(pCVar1->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header) {
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&local_e0->generator_parameters_,(key_type *)(iVar4._M_node + 2));
            sVar10 = pmVar6->_M_string_length;
            goto joined_r0x00208cf5;
          }
          pcVar14 = local_a0 + 0x10;
          local_a0._0_8_ = pcVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"--","");
          if ((string *)name->_M_string_length < (ulong)local_a0._8_8_) {
            bVar18 = false;
          }
          else {
            iVar3 = std::__cxx11::string::compare((ulong)name,0,(string *)local_a0._8_8_);
            bVar18 = iVar3 == 0;
          }
          if (bVar18) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_opt","");
            if ((string *)name->_M_string_length < local_100._M_string_length) goto LAB_00208b75;
            iVar3 = std::__cxx11::string::compare
                              ((ulong)name,(long)name->_M_string_length - local_100._M_string_length
                               ,(string *)local_100._M_string_length);
            bVar19 = iVar3 == 0;
          }
          else {
LAB_00208b75:
            bVar19 = false;
          }
          if ((bVar18) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2)) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          if ((char *)local_a0._0_8_ != pcVar14) {
            operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
          }
          if (bVar19) {
            this_01 = &local_e0->plugin_parameters_;
            anon_unknown_0::PluginName((string *)local_a0,&local_e0->plugin_prefix_,name);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](this_01,(string *)local_a0);
            if ((char *)local_a0._0_8_ != pcVar14) {
              operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
            }
            sVar10 = pmVar6->_M_string_length;
joined_r0x00208cf5:
            if (sVar10 != 0) {
              std::__cxx11::string::append((char *)pmVar6);
            }
            std::__cxx11::string::_M_append((char *)pmVar6,(ulong)(value->_M_dataplus)._M_p);
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown flag: ",0xe);
          pcVar13 = (name->_M_dataplus)._M_p;
          sVar10 = name->_M_string_length;
          goto LAB_0020867b;
        }
        if (local_e0->mode_ == MODE_COMPILE) {
          local_a0._0_8_ = local_a0 + 0x10;
          local_a0._8_8_ = (char *)0x0;
          local_a0[0x10] = '\0';
          local_78._0_8_ = &local_68;
          local_78._8_8_ = 0;
          local_68._M_local_buf[0] = '\0';
          local_58._M_p = (pointer)&local_48;
          local_50 = 0;
          local_48._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_assign((string *)local_a0);
          if (iVar4._M_node == local_38) {
            local_a0._32_8_ = (pointer)0x0;
          }
          else {
            local_a0._32_8_ = *(undefined8 *)(p_Var5 + 2);
          }
          lVar11 = std::__cxx11::string::find(cVar15,0x3a);
          if (lVar11 == -1) {
            std::__cxx11::string::_M_assign((string *)&local_58);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_100,(ulong)value);
            std::__cxx11::string::operator=((string *)local_78,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::string::substr((ulong)&local_100,(ulong)value);
            std::__cxx11::string::operator=((string *)&local_58,(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                       local_100.field_2._M_local_buf[0]) + 1);
            }
          }
          std::
          vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
          ::push_back(&local_e0->output_directives_,(value_type *)local_a0);
          OutputDirective::~OutputDirective((OutputDirective *)local_a0);
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        poVar9 = (ostream *)&std::cerr;
        pcVar14 = 
        "Cannot use --encode, --decode or print .proto info and generate code at the same time.";
        lVar11 = 0x56;
      }
    }
  }
LAB_0020832c:
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar11);
LAB_00208334:
  std::endl<char,std::char_traits<char>>(poVar9);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const string& name,
                                        const string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to " << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    input_files_.push_back(value);

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<string> parts = Split(
        value, kPathSeparator, true);

    for (int i = 0; i < parts.size(); i++) {
      string virtual_path;
      string disk_path;

      string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happed to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(std::pair<string, string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name << " may only be passed once. To specify multiple "
                           "direct dependencies, pass them all as a single "
                           "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<string> direct = Split(
        value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    cout << "libprotoc "
         << protobuf::internal::VersionString(GOOGLE_PROTOBUF_VERSION)
         << endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    string plugin_name;
    string path;

    string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == string::npos) {
      // Use the basename of the file.
      string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--profile_path") {
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        string* parameters = &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time." << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}